

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nstime.c
# Opt level: O1

void nstime_prof_update_impl(nstime_t *time)

{
  clockid_t __clock_id;
  timespec ts;
  timespec local_20;
  
  if (duckdb_je_opt_prof_time_res == prof_time_res_high) {
    __clock_id = 0;
  }
  else {
    __clock_id = 6;
  }
  clock_gettime(__clock_id,&local_20);
  time->ns = local_20.tv_sec * 1000000000 + local_20.tv_nsec;
  return;
}

Assistant:

static void
nstime_prof_update_impl(nstime_t *time) {
	nstime_t old_time;

	nstime_copy(&old_time, time);

	if (opt_prof_time_res == prof_time_res_high) {
		nstime_get_realtime(time);
	} else {
		nstime_get(time);
	}
}